

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall
cbtTaskSchedulerDefault::parallelFor
          (cbtTaskSchedulerDefault *this,int iBegin,int iEnd,int grainSize,cbtIParallelForBody *body
          )

{
  int iVar1;
  JobQueue *this_00;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  int jobCount;
  int iVar5;
  long lVar6;
  int i;
  int iVar7;
  long lVar8;
  CProfileSample __profile_1;
  CProfileSample __profile;
  
  CProfileSample::CProfileSample((CProfileSample *)&__profile,"parallelFor_ThreadSupport");
  if ((grainSize < iEnd - iBegin) && (0 < this->m_numWorkerThreads)) {
    bVar4 = cbtSpinMutex::tryLock(&this->m_antiNestingLock);
    if (bVar4) {
      lVar6 = 0;
      jobCount = (grainSize + -1 + (iEnd - iBegin)) / grainSize;
      this->m_numJobs = jobCount;
      for (lVar8 = 0; lVar8 < this->m_numActiveJobQueues; lVar8 = lVar8 + 1) {
        JobQueue::clearQueue
                  ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar6 + -0x78),
                   jobCount,0x18);
        lVar6 = lVar6 + 0xb8;
      }
      prepareWorkerThreads(this);
      iVar7 = 1;
      while (iBegin < iEnd) {
        this_00 = (this->m_perThreadJobQueues).m_data[iVar7];
        iVar5 = iBegin + grainSize;
        iVar3 = iEnd;
        if (iVar5 < iEnd) {
          iVar3 = iVar5;
        }
        iVar1 = this_00->m_allocSize;
        pcVar2 = this_00->m_jobMem;
        this_00->m_allocSize = iVar1 + 0x18;
        *(undefined ***)(pcVar2 + iVar1) = &PTR_executeJob_01197e68;
        *(cbtIParallelForBody **)(pcVar2 + (long)iVar1 + 8) = body;
        *(int *)(pcVar2 + (long)iVar1 + 0x10) = iBegin;
        *(int *)(pcVar2 + (long)iVar1 + 0x14) = iVar3;
        JobQueue::submitJob(this_00,(IJob *)(pcVar2 + iVar1));
        iVar7 = iVar7 + 1;
        iBegin = iVar5;
        if (this->m_numThreads <= iVar7) {
          iVar7 = 1;
        }
      }
      wakeWorkers(this,jobCount + -1);
      waitJobs(this);
      cbtSpinMutex::unlock(&this->m_antiNestingLock);
      goto LAB_00e1b39c;
    }
  }
  CProfileSample::CProfileSample((CProfileSample *)&__profile_1,"parallelFor_mainThread");
  (*body->_vptr_cbtIParallelForBody[2])(body,(ulong)(uint)iBegin,(ulong)(uint)iEnd);
  CProfileSample::~CProfileSample((CProfileSample *)&__profile_1);
LAB_00e1b39c:
  CProfileSample::~CProfileSample((CProfileSample *)&__profile);
  return;
}

Assistant:

virtual void parallelFor(int iBegin, int iEnd, int grainSize, const cbtIParallelForBody& body) BT_OVERRIDE
	{
		BT_PROFILE("parallelFor_ThreadSupport");
		cbtAssert(iEnd >= iBegin);
		cbtAssert(grainSize >= 1);
		int iterationCount = iEnd - iBegin;
		if (iterationCount > grainSize && m_numWorkerThreads > 0 && m_antiNestingLock.tryLock())
		{
			typedef ParallelForJob JobType;
			int jobCount = (iterationCount + grainSize - 1) / grainSize;
			m_numJobs = jobCount;
			cbtAssert(jobCount >= 2);  // need more than one job for multithreading
			int jobSize = sizeof(JobType);

			for (int i = 0; i < m_numActiveJobQueues; ++i)
			{
				m_jobQueues[i].clearQueue(jobCount, jobSize);
			}
			// prepare worker threads for incoming work
			prepareWorkerThreads();
			// submit all of the jobs
			int iJob = 0;
			int iThread = kFirstWorkerThreadId;  // first worker thread
			for (int i = iBegin; i < iEnd; i += grainSize)
			{
				cbtAssert(iJob < jobCount);
				int iE = cbtMin(i + grainSize, iEnd);
				JobQueue* jq = m_perThreadJobQueues[iThread];
				cbtAssert(jq);
				cbtAssert((jq - &m_jobQueues[0]) < m_numActiveJobQueues);
				void* jobMem = jq->allocJobMem(jobSize);
				JobType* job = new (jobMem) ParallelForJob(i, iE, body);  // placement new
				jq->submitJob(job);
				iJob++;
				iThread++;
				if (iThread >= m_numThreads)
				{
					iThread = kFirstWorkerThreadId;  // first worker thread
				}
			}
			wakeWorkers(jobCount - 1);

			// put the main thread to work on emptying the job queue and then wait for all workers to finish
			waitJobs();
			m_antiNestingLock.unlock();
		}
		else
		{
			BT_PROFILE("parallelFor_mainThread");
			// just run on main thread
			body.forLoop(iBegin, iEnd);
		}
	}